

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucurr.cpp
# Opt level: O3

CurrencyNameCacheEntry * getCacheEntry(char *locale,UErrorCode *ec)

{
  ushort uVar1;
  short sVar2;
  char *locale_00;
  UBool UVar3;
  int iVar4;
  int32_t iVar5;
  int32_t iVar6;
  UErrorCode UVar7;
  UResourceBundle *pUVar8;
  UChar *pUVar9;
  UnicodeString *pUVar10;
  UResourceBundle *pUVar11;
  CurrencyNameStruct *pCVar12;
  CurrencyNameStruct *__base;
  char *pcVar13;
  void *pvVar14;
  CurrencyNameCacheEntry *pCVar15;
  int iVar16;
  long lVar17;
  int32_t *piVar18;
  UHashtable *hash;
  int iVar19;
  uint uVar20;
  UErrorCode ec2_1;
  UErrorCode ec2;
  UErrorCode ec4;
  int32_t len;
  UErrorCode ec3;
  EquivIterator iter;
  char locale_1 [157];
  char loc [157];
  UErrorCode local_294;
  UResourceBundle *local_290;
  UResourceBundle *local_288;
  UResourceBundle *local_280;
  int32_t local_278;
  UErrorCode local_274;
  UResourceBundle *local_270;
  ConstChar16Ptr local_268;
  int local_25c;
  UErrorCode *local_258;
  CurrencyNameStruct *local_250;
  char *local_248;
  UHashtable *local_240;
  ConstChar16Ptr local_238;
  int32_t local_230;
  int32_t local_22c;
  UResourceBundle *local_228;
  CurrencyNameStruct *local_220;
  UObject local_218;
  UResourceBundle *local_210;
  UResourceBundle *local_208;
  EquivIterator local_200;
  int32_t *local_1e8;
  int32_t *local_1e0;
  UChar *local_1d8;
  UChar *local_1c8;
  UnicodeString local_1b8;
  UnicodeString local_178 [2];
  char local_d8 [168];
  
  local_258 = ec;
  umtx_lock_63(&gCurrencyCacheMutex);
  lVar17 = 0;
  do {
    if ((*(char **)((long)currCache + lVar17) != (char *)0x0) &&
       (iVar4 = strcmp(locale,*(char **)((long)currCache + lVar17)), iVar4 == 0)) {
      pCVar15 = *(CurrencyNameCacheEntry **)((long)currCache + lVar17);
      goto LAB_002c7140;
    }
    lVar17 = lVar17 + 8;
  } while (lVar17 != 0x50);
  umtx_unlock_63(&gCurrencyCacheMutex);
  local_218._vptr_UObject = (_func_int **)getCurrSymbolsEquiv();
  local_274 = U_ZERO_ERROR;
  local_248 = locale;
  uloc_getName_63(locale,local_d8,0x9d,&local_274);
  if (U_ZERO_ERROR < local_274 || local_274 == U_STRING_NOT_TERMINATED_WARNING) {
    *local_258 = U_ILLEGAL_ARGUMENT_ERROR;
  }
  strcpy((char *)local_178,local_d8);
  pUVar8 = (UResourceBundle *)0x0;
  local_288 = (UResourceBundle *)getCurrSymbolsEquiv();
  iVar4 = 0;
  do {
    local_294 = U_ZERO_ERROR;
    local_280 = ures_open_63("icudt63l-curr",(char *)local_178,&local_294);
    local_270 = ures_getByKey_63(local_280,"Currencies",(UResourceBundle *)0x0,&local_294);
    iVar5 = ures_getSize_63(local_270);
    if (0 < iVar5) {
      local_290 = (UResourceBundle *)(ulong)(uint)((int)pUVar8 + iVar5);
      iVar16 = 0;
      do {
        pUVar8 = ures_getByIndex_63(local_270,iVar16,(UResourceBundle *)0x0,&local_294);
        pUVar9 = ures_getStringByIndex_63(pUVar8,0,&local_22c,&local_294);
        if (local_288 == (UResourceBundle *)0x0) {
          iVar4 = iVar4 + 1;
        }
        else {
          local_268.p_ = pUVar9;
          icu_63::UnicodeString::UnicodeString(&local_1b8,'\x01',&local_268,local_22c);
          local_200._hash = (Hashtable *)local_288;
          local_200._start = &local_1b8;
          local_200._current = &local_1b8;
          do {
            pUVar10 = icu_63::EquivIterator::next(&local_200);
            iVar4 = iVar4 + 1;
          } while (pUVar10 != (UnicodeString *)0x0);
          icu_63::UnicodeString::~UnicodeString(&local_1b8);
          local_1c8 = local_268.p_;
        }
        iVar4 = iVar4 + 1;
        ures_close_63(pUVar8);
        iVar16 = iVar16 + 1;
        pUVar8 = local_290;
      } while (iVar16 != iVar5);
    }
    local_1b8.super_Replaceable.super_UObject._vptr_UObject =
         (UObject)((ulong)local_1b8.super_Replaceable.super_UObject._vptr_UObject &
                  0xffffffff00000000);
    pUVar11 = ures_getByKey_63(local_280,"CurrencyPlurals",(UResourceBundle *)0x0,
                               (UErrorCode *)&local_1b8);
    iVar5 = ures_getSize_63(pUVar11);
    local_290 = pUVar11;
    if (0 < iVar5) {
      iVar16 = 0;
      do {
        pUVar11 = ures_getByIndex_63(local_290,iVar16,(UResourceBundle *)0x0,
                                     (UErrorCode *)&local_1b8);
        iVar6 = ures_getSize_63(pUVar11);
        pUVar8 = (UResourceBundle *)(ulong)(uint)((int)pUVar8 + iVar6);
        ures_close_63(pUVar11);
        iVar16 = iVar16 + 1;
      } while (iVar5 != iVar16);
    }
    ures_close_63(local_290);
    ures_close_63(local_270);
    ures_close_63(local_280);
    UVar3 = fallback((char *)local_178);
  } while (UVar3 != '\0');
  pCVar12 = (CurrencyNameStruct *)uprv_malloc_63((long)(int)pUVar8 * 0x18);
  __base = (CurrencyNameStruct *)uprv_malloc_63((long)iVar4 * 0x18);
  if (*local_258 < U_ILLEGAL_ARGUMENT_ERROR) {
    local_200._hash = (Hashtable *)((ulong)local_200._hash & 0xffffffff00000000);
    local_290 = (UResourceBundle *)0x0;
    local_268.p_ = local_268.p_ & 0xffffffff00000000;
    local_270 = (UResourceBundle *)
                uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,
                              (UErrorCode *)&local_200);
    local_240 = uhash_open_63(uhash_hashChars_63,uhash_compareChars_63,(undefined1 *)0x0,
                              (UErrorCode *)&local_268);
    local_1e8 = &__base->flag;
    local_1e0 = &pCVar12->flag;
    local_280 = (UResourceBundle *)0x0;
    iVar4 = 0;
    local_250 = __base;
    local_220 = pCVar12;
    do {
      local_274 = U_ZERO_ERROR;
      local_228 = ures_open_63("icudt63l-curr",local_d8,&local_274);
      local_210 = ures_getByKey_63(local_228,"Currencies",(UResourceBundle *)0x0,&local_274);
      local_278 = ures_getSize_63(local_210);
      local_25c = iVar4;
      if (0 < local_278) {
        iVar16 = 0;
        do {
          pUVar8 = ures_getByIndex_63(local_210,iVar16,(UResourceBundle *)0x0,&local_274);
          pUVar9 = ures_getStringByIndex_63(pUVar8,0,&local_294,&local_274);
          local_288 = pUVar8;
          pcVar13 = ures_getKey_63(pUVar8);
          if ((iVar4 == 0) ||
             (pvVar14 = uhash_get_63((UHashtable *)local_270,pcVar13), pvVar14 == (void *)0x0)) {
            uhash_put_63((UHashtable *)local_270,pcVar13,pcVar13,(UErrorCode *)&local_200);
            iVar4 = (int)local_280;
            iVar19 = iVar4 + 1;
            __base[iVar4].IsoCode = pcVar13;
            __base[iVar4].currencyName = pUVar9;
            __base[iVar4].flag = 0;
            __base[iVar4].currencyNameLen = local_294;
            if ((Hashtable *)local_218._vptr_UObject != (Hashtable *)0x0) {
              local_238.p_ = pUVar9;
              icu_63::UnicodeString::UnicodeString(local_178,'\x01',&local_238,local_294);
              local_1d8 = local_238.p_;
              local_1b8.super_Replaceable.super_UObject._vptr_UObject =
                   (UObject)(UObject)local_218._vptr_UObject;
              piVar18 = local_1e8 + (long)iVar19 * 6;
              local_1b8.fUnion._0_8_ = local_178;
              local_1b8.fUnion._8_8_ = local_178;
              while (pUVar10 = icu_63::EquivIterator::next((EquivIterator *)&local_1b8),
                    pUVar10 != (UnicodeString *)0x0) {
                ((CurrencyNameStruct *)(piVar18 + -5))->IsoCode = pcVar13;
                uVar1 = (pUVar10->fUnion).fStackFields.fLengthAndFlags;
                if ((uVar1 & 0x11) == 0) {
                  if ((uVar1 & 2) == 0) {
                    pUVar9 = (pUVar10->fUnion).fFields.fArray;
                  }
                  else {
                    pUVar9 = (UChar *)((long)&pUVar10->fUnion + 2);
                  }
                }
                else {
                  pUVar9 = (UChar *)0x0;
                }
                *(UChar **)(piVar18 + -3) = pUVar9;
                *piVar18 = 0;
                sVar2 = (pUVar10->fUnion).fStackFields.fLengthAndFlags;
                if (sVar2 < 0) {
                  iVar5 = (pUVar10->fUnion).fFields.fLength;
                }
                else {
                  iVar5 = (int)sVar2 >> 5;
                }
                piVar18[-1] = iVar5;
                iVar19 = iVar19 + 1;
                piVar18 = piVar18 + 6;
              }
              icu_63::UnicodeString::~UnicodeString(local_178);
            }
            pUVar9 = ures_getStringByIndex_63(local_288,1,&local_294,&local_274);
            pCVar12 = local_220;
            iVar4 = (int)local_290;
            local_220[iVar4].IsoCode = pcVar13;
            pUVar9 = toUpperCase(pUVar9,local_294,local_248);
            __base = local_250;
            pCVar12[iVar4].currencyName = pUVar9;
            pCVar12[iVar4].flag = 1;
            local_290 = (UResourceBundle *)(ulong)(iVar4 + 1);
            pCVar12[iVar4].currencyNameLen = local_294;
            local_250[iVar19].IsoCode = pcVar13;
            pUVar9 = (UChar *)uprv_malloc_63(6);
            __base[iVar19].currencyName = pUVar9;
            u_charsToUChars_63(pcVar13,pUVar9,3);
            local_280 = (UResourceBundle *)(ulong)(iVar19 + 1);
            __base[iVar19].currencyNameLen = 3;
            __base[iVar19].flag = 1;
            iVar4 = local_25c;
          }
          ures_close_63(local_288);
          iVar16 = iVar16 + 1;
        } while (iVar16 != local_278);
      }
      local_178[0].super_Replaceable.super_UObject._vptr_UObject._0_4_ = 0;
      local_208 = ures_getByKey_63(local_228,"CurrencyPlurals",(UResourceBundle *)0x0,
                                   (UErrorCode *)local_178);
      local_230 = ures_getSize_63(local_208);
      hash = local_240;
      if (0 < local_230) {
        iVar5 = 0;
        do {
          local_288 = ures_getByIndex_63(local_208,iVar5,(UResourceBundle *)0x0,
                                         (UErrorCode *)local_178);
          pcVar13 = ures_getKey_63(local_288);
          if ((iVar4 == 0) || (pvVar14 = uhash_get_63(hash,pcVar13), pvVar14 == (void *)0x0)) {
            local_278 = iVar5;
            uhash_put_63(hash,pcVar13,pcVar13,(UErrorCode *)&local_268);
            iVar5 = ures_getSize_63(local_288);
            locale_00 = local_248;
            pUVar8 = local_288;
            if (0 < iVar5) {
              piVar18 = local_1e0 + (long)(int)local_290 * 6;
              iVar4 = 0;
              do {
                pUVar9 = ures_getStringByIndex_63
                                   (pUVar8,iVar4,(int32_t *)&local_1b8,(UErrorCode *)local_178);
                ((CurrencyNameStruct *)(piVar18 + -5))->IsoCode = pcVar13;
                pUVar9 = toUpperCase(pUVar9,(int32_t)local_1b8.super_Replaceable.super_UObject.
                                                     _vptr_UObject,locale_00);
                *(UChar **)(piVar18 + -3) = pUVar9;
                *piVar18 = 1;
                piVar18[-1] = (int32_t)local_1b8.super_Replaceable.super_UObject._vptr_UObject;
                iVar4 = iVar4 + 1;
                piVar18 = piVar18 + 6;
              } while (iVar5 != iVar4);
              local_290 = (UResourceBundle *)(ulong)(uint)((int)local_290 + iVar4);
              hash = local_240;
              __base = local_250;
              iVar4 = local_25c;
            }
            ures_close_63(pUVar8);
            iVar5 = local_278;
          }
          else {
            ures_close_63(local_288);
          }
          iVar5 = iVar5 + 1;
        } while (iVar5 != local_230);
      }
      ures_close_63(local_208);
      ures_close_63(local_210);
      ures_close_63(local_228);
      UVar3 = fallback(local_d8);
      iVar4 = iVar4 + 1;
    } while (UVar3 != '\0');
    uhash_close_63((UHashtable *)local_270);
    uhash_close_63(hash);
    pCVar12 = local_220;
    qsort(local_220,(long)(int)local_290,0x18,currencyNameComparator);
    qsort(__base,(long)(int)local_280,0x18,currencyNameComparator);
    UVar7 = (UErrorCode)local_200._hash;
    if (((UErrorCode)local_200._hash < U_ILLEGAL_ARGUMENT_ERROR) &&
       (UVar7 = (UErrorCode)local_268.p_, (UErrorCode)local_268.p_ < U_ILLEGAL_ARGUMENT_ERROR)) {
      if (*local_258 < U_ILLEGAL_ARGUMENT_ERROR) {
        umtx_lock_63(&gCurrencyCacheMutex);
        lVar17 = 0;
        while ((*(char **)((long)currCache + lVar17) == (char *)0x0 ||
               (iVar4 = strcmp(local_248,*(char **)((long)currCache + lVar17)), iVar4 != 0))) {
          lVar17 = lVar17 + 8;
          if (lVar17 == 0x50) {
            pCVar15 = currCache[(byte)currentCacheEntryIndex];
            if (pCVar15 != (CurrencyNameCacheEntry *)0x0) {
              piVar18 = &pCVar15->refCount;
              *piVar18 = *piVar18 + -1;
              if (*piVar18 == 0) {
                deleteCacheEntry(pCVar15);
              }
            }
            pCVar15 = (CurrencyNameCacheEntry *)uprv_malloc_63(0xc0);
            uVar20 = (uint)(byte)currentCacheEntryIndex;
            currCache[uVar20] = pCVar15;
            strcpy((char *)pCVar15,local_248);
            pCVar15->currencyNames = pCVar12;
            pCVar15->totalCurrencyNameCount = (int32_t)local_290;
            pCVar15->currencySymbols = local_250;
            pCVar15->totalCurrencySymbolCount = (int32_t)local_280;
            pCVar15->refCount = 2;
            uVar20 = uVar20 + 1;
            currentCacheEntryIndex = (char)uVar20 + ((byte)((uVar20 & 0xff) / 5) & 0xfe) * -5;
            ucln_common_registerCleanup_63(UCLN_COMMON_CURRENCY,currency_cleanup);
LAB_002c7146:
            umtx_unlock_63(&gCurrencyCacheMutex);
            return pCVar15;
          }
        }
        deleteCurrencyNames(pCVar12,(int32_t)local_290);
        deleteCurrencyNames(local_250,(int32_t)local_280);
        pCVar15 = *(CurrencyNameCacheEntry **)((long)currCache + lVar17);
LAB_002c7140:
        pCVar15->refCount = pCVar15->refCount + 1;
        goto LAB_002c7146;
      }
    }
    else {
      *local_258 = UVar7;
    }
  }
  return (CurrencyNameCacheEntry *)0x0;
}

Assistant:

static CurrencyNameCacheEntry*
getCacheEntry(const char* locale, UErrorCode& ec) {

    int32_t total_currency_name_count = 0;
    CurrencyNameStruct* currencyNames = NULL;
    int32_t total_currency_symbol_count = 0;
    CurrencyNameStruct* currencySymbols = NULL;
    CurrencyNameCacheEntry* cacheEntry = NULL;

    umtx_lock(&gCurrencyCacheMutex);
    // in order to handle racing correctly,
    // not putting 'search' in a separate function.
    int8_t found = -1;
    for (int8_t i = 0; i < CURRENCY_NAME_CACHE_NUM; ++i) {
        if (currCache[i]!= NULL &&
            uprv_strcmp(locale, currCache[i]->locale) == 0) {
            found = i;
            break;
        }
    }
    if (found != -1) {
        cacheEntry = currCache[found];
        ++(cacheEntry->refCount);
    }
    umtx_unlock(&gCurrencyCacheMutex);
    if (found == -1) {
        collectCurrencyNames(locale, &currencyNames, &total_currency_name_count, &currencySymbols, &total_currency_symbol_count, ec);
        if (U_FAILURE(ec)) {
            return NULL;
        }
        umtx_lock(&gCurrencyCacheMutex);
        // check again.
        for (int8_t i = 0; i < CURRENCY_NAME_CACHE_NUM; ++i) {
            if (currCache[i]!= NULL &&
                uprv_strcmp(locale, currCache[i]->locale) == 0) {
                found = i;
                break;
            }
        }
        if (found == -1) {
            // insert new entry to 
            // currentCacheEntryIndex % CURRENCY_NAME_CACHE_NUM
            // and remove the existing entry 
            // currentCacheEntryIndex % CURRENCY_NAME_CACHE_NUM
            // from cache.
            cacheEntry = currCache[currentCacheEntryIndex];
            if (cacheEntry) {
                --(cacheEntry->refCount);
                // delete if the ref count is zero
                if (cacheEntry->refCount == 0) {
                    deleteCacheEntry(cacheEntry);
                }
            }
            cacheEntry = (CurrencyNameCacheEntry*)uprv_malloc(sizeof(CurrencyNameCacheEntry));
            currCache[currentCacheEntryIndex] = cacheEntry;
            uprv_strcpy(cacheEntry->locale, locale);
            cacheEntry->currencyNames = currencyNames;
            cacheEntry->totalCurrencyNameCount = total_currency_name_count;
            cacheEntry->currencySymbols = currencySymbols;
            cacheEntry->totalCurrencySymbolCount = total_currency_symbol_count;
            cacheEntry->refCount = 2; // one for cache, one for reference
            currentCacheEntryIndex = (currentCacheEntryIndex + 1) % CURRENCY_NAME_CACHE_NUM;
            ucln_common_registerCleanup(UCLN_COMMON_CURRENCY, currency_cleanup);
        } else {
            deleteCurrencyNames(currencyNames, total_currency_name_count);
            deleteCurrencyNames(currencySymbols, total_currency_symbol_count);
            cacheEntry = currCache[found];
            ++(cacheEntry->refCount);
        }
        umtx_unlock(&gCurrencyCacheMutex);
    }

    return cacheEntry;
}